

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str *
tinyformat::format<bilingual_str,bilingual_str>
          (bilingual_str *fmt,bilingual_str *args,bilingual_str *args_1)

{
  long lVar1;
  string *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  undefined8 in_stack_ffffffffffffff68;
  bool translated;
  bilingual_str *this;
  bilingual_str *fmt_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  translated = SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0);
  this = in_RDI;
  fmt_00 = in_RDI;
  args_00 = format<bilingual_str,bilingual_str>(bilingual_str_const&,bilingual_str_const&,bilingual_str_const&)
            ::{lambda(auto:1_const&,bool)#1}::operator()
                      ((anon_class_1_0_00000001 *)in_RDI,in_RDI,translated);
  format<bilingual_str,bilingual_str>(bilingual_str_const&,bilingual_str_const&,bilingual_str_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()((anon_class_1_0_00000001 *)this,in_RDI,translated);
  format<std::__cxx11::string,std::__cxx11::string>(&fmt_00->original,args_00,in_RSI);
  format<bilingual_str,bilingual_str>(bilingual_str_const&,bilingual_str_const&,bilingual_str_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()((anon_class_1_0_00000001 *)this,in_RDI,translated);
  format<bilingual_str,bilingual_str>(bilingual_str_const&,bilingual_str_const&,bilingual_str_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()((anon_class_1_0_00000001 *)this,in_RDI,translated);
  format<std::__cxx11::string,std::__cxx11::string>(&fmt_00->original,args_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}